

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

int __thiscall ON_String::Replace(ON_String *this,char utf8_single_byte_c1,char utf8_single_byte_c2)

{
  long lVar1;
  int iVar2;
  ON_Internal_Empty_aString *pOVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c1);
  if ((iVar2 != 0) && (iVar2 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c2), iVar2 != 0))
  {
    pOVar3 = &empty_astring;
    if (this->m_s != (char *)0x0) {
      pOVar3 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
    }
    lVar5 = (long)(pOVar3->header).string_length;
    iVar2 = 0;
    do {
      pcVar4 = this->m_s;
      lVar6 = lVar5;
      do {
        lVar5 = lVar6 + -1;
        if (lVar6 == 0) {
          return iVar2;
        }
        lVar1 = lVar6 + -1;
        lVar6 = lVar5;
      } while (pcVar4[lVar1] != utf8_single_byte_c1);
      if (iVar2 == 0) {
        CopyArray(this);
        pcVar4 = this->m_s;
      }
      pcVar4[lVar5] = utf8_single_byte_c2;
      iVar2 = iVar2 + 1;
    } while( true );
  }
  return 0;
}

Assistant:

int ON_String::Replace(char utf8_single_byte_c1, char utf8_single_byte_c2)
{
  int count = 0;
  if (ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c1) && ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c2))
  {
    int i = Length();
    while (i--)
    {
      if (utf8_single_byte_c1 == m_s[i])
      {
        if (0 == count)
          CopyArray();
        m_s[i] = utf8_single_byte_c2;
        count++;
      }
    }
  }
  return count;
}